

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O1

void __thiscall PatternBlock::restoreXml(PatternBlock *this,Element *el)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  Element *this_00;
  iterator iVar3;
  string *psVar4;
  pointer ppEVar5;
  uintm val;
  uintm mask;
  istringstream s;
  uint local_1f0;
  uint local_1ec;
  string local_1e8;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_1c8;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_1c0;
  Element *local_1b8;
  long local_1b0 [3];
  uint auStack_198 [24];
  ios_base local_138 [264];
  
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"offset","");
  psVar4 = Element::getAttributeValue(el,&local_1e8);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)psVar4,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  puVar2 = (uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18));
  *puVar2 = *puVar2 & 0xffffffb5;
  std::istream::operator>>(local_1b0,&this->offset);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"nonzero","");
  psVar4 = Element::getAttributeValue(el,&local_1e8);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)psVar4,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  puVar2 = (uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18));
  *puVar2 = *puVar2 & 0xffffffb5;
  std::istream::operator>>(local_1b0,&this->nonzerosize);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  ppEVar5 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1b8 = el;
  if (ppEVar5 !=
      (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1c0 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->maskvec;
    local_1c8 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->valvec;
    do {
      this_00 = *ppEVar5;
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"mask","");
      psVar4 = Element::getAttributeValue(this_00,&local_1e8);
      std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)psVar4,_S_in);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      puVar2 = (uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18));
      *puVar2 = *puVar2 & 0xffffffb5;
      std::istream::_M_extract<unsigned_int>((uint *)local_1b0);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"val","");
      psVar4 = Element::getAttributeValue(this_00,&local_1e8);
      std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)psVar4,_S_in);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      puVar2 = (uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18));
      *puVar2 = *puVar2 & 0xffffffb5;
      std::istream::_M_extract<unsigned_int>((uint *)local_1b0);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
      iVar3._M_current =
           (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_1c0,iVar3,&local_1ec);
      }
      else {
        *iVar3._M_current = local_1ec;
        (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      iVar3._M_current =
           (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_1c8,iVar3,&local_1f0);
      }
      else {
        *iVar3._M_current = local_1f0;
        (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      ppEVar5 = ppEVar5 + 1;
    } while (ppEVar5 !=
             (local_1b8->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  normalize(this);
  return;
}

Assistant:

void PatternBlock::restoreXml(const Element *el)

{
  {
    istringstream s(el->getAttributeValue("offset"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> offset;
  }
  {
    istringstream s(el->getAttributeValue("nonzero"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> nonzerosize;
  }
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  uintm mask,val;
  while(iter != list.end()) {
    Element *subel = *iter;
    {
      istringstream s(subel->getAttributeValue("mask"));
      s.unsetf(ios::dec | ios::hex | ios::oct);
      s >> mask;
    }
    {
      istringstream s(subel->getAttributeValue("val"));
      s.unsetf(ios::dec | ios::hex | ios::oct);
      s >> val;
    }
    maskvec.push_back(mask);
    valvec.push_back(val);
    ++iter;
  }
  normalize();
}